

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNIntersector1<4,_1,_true,_embree::sse2::SubdivPatch1Intersector1>::intersect
          (BVHNIntersector1<4,_1,_true,_embree::sse2::SubdivPatch1Intersector1> *this,
          Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  Intersector1 *pIVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Collider CVar8;
  int iVar9;
  code *pcVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  ulong uVar21;
  RayQueryContext *pRVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [8];
  undefined4 uVar26;
  ulong uVar27;
  long lVar28;
  Scene *pSVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar83;
  float fVar84;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar105;
  float fVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar107;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  float fVar116;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar167;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  vbool<4> valid;
  MapUV<embree::sse2::GridSOA::Gather2x3> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_124c;
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  undefined8 local_1238;
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  undefined8 uStack_1220;
  undefined1 local_1218 [8];
  undefined8 uStack_1210;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  ulong local_11e8;
  Intersectors *local_11e0;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  float *local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  int *local_1198;
  Scene *local_1190;
  RayQueryContext *local_1188;
  Intersectors *local_1180;
  float *local_1178;
  undefined4 local_1170;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined8 local_1158;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float local_1134;
  float local_1130;
  float local_112c;
  float local_1128;
  undefined4 local_1124;
  undefined4 local_1120;
  float local_111c;
  float local_1118;
  undefined1 local_1108 [16];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [16];
  float **local_10d8;
  undefined1 local_10c8 [16];
  float local_10b8 [4];
  float local_10a8 [4];
  float local_1098 [4];
  float local_1088 [4];
  float local_1078 [4];
  float local_1068 [4];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  long local_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)(*(long *)this + 0x70) == 8) {
    return;
  }
  pauVar31 = (undefined1 (*) [16])local_f68;
  local_f78 = *(long *)(*(long *)this + 0x70);
  uStack_f70 = 0;
  fVar139 = *(float *)&This->ptr;
  fVar126 = *(float *)((long)&This->ptr + 4);
  fVar143 = *(float *)&This->leafIntersector;
  fVar127 = *(float *)((long)&This->leafIntersector + 4);
  CVar8 = This->collider;
  fVar156 = *(float *)&(This->intersector1).intersect;
  fVar157 = 0.0;
  if (0.0 <= fVar156) {
    fVar157 = fVar156;
  }
  uVar34 = -(uint)(1e-18 <= ABS(CVar8.collide._0_4_));
  uVar35 = -(uint)(1e-18 <= ABS(CVar8.collide._4_4_));
  uVar39 = -(uint)(1e-18 <= ABS(CVar8.name._0_4_));
  auVar96 = divps(_DAT_01f46a60,(undefined1  [16])CVar8);
  fVar156 = 0.0;
  if (0.0 <= fVar127) {
    fVar156 = fVar127;
  }
  fVar135 = (float)(~uVar34 & 0x5d5e0b6b | auVar96._0_4_ & uVar34);
  fVar138 = (float)(~uVar35 & 0x5d5e0b6b | auVar96._4_4_ & uVar35);
  fVar141 = (float)(~uVar39 & 0x5d5e0b6b | auVar96._8_4_ & uVar39);
  fVar144 = fVar135 * 0.99999964;
  fVar147 = fVar138 * 0.99999964;
  fVar149 = fVar141 * 0.99999964;
  fVar135 = fVar135 * 1.0000004;
  fVar138 = fVar138 * 1.0000004;
  fVar141 = fVar141 * 1.0000004;
  uVar30 = (ulong)(fVar144 < 0.0) << 4;
  uVar33 = (ulong)(fVar147 < 0.0) << 4 | 0x20;
  uVar24 = (ulong)(fVar149 < 0.0) << 4 | 0x40;
  uVar32 = uVar30 ^ 0x10;
  auVar96._4_4_ = fVar157;
  auVar96._0_4_ = fVar157;
  auVar96._8_4_ = fVar157;
  auVar96._12_4_ = fVar157;
  _local_fe8 = mm_lookupmask_ps._240_8_;
  _uStack_fe0 = mm_lookupmask_ps._248_8_;
  uVar21 = 0;
  local_11e0 = This;
  local_fa8 = fVar141;
  fStack_fa4 = fVar141;
  fStack_fa0 = fVar141;
  fStack_f9c = fVar141;
  local_1048 = fVar126;
  fStack_1044 = fVar126;
  fStack_1040 = fVar126;
  fStack_103c = fVar126;
  local_11e8 = uVar30;
  local_fd8 = fVar144;
  fStack_fd4 = fVar144;
  fStack_fd0 = fVar144;
  fStack_fcc = fVar144;
  local_ff8 = fVar147;
  fStack_ff4 = fVar147;
  fStack_ff0 = fVar147;
  fStack_fec = fVar147;
  local_1008 = fVar135;
  fStack_1004 = fVar135;
  fStack_1000 = fVar135;
  fStack_ffc = fVar135;
  local_1058 = fVar138;
  fStack_1054 = fVar138;
  fStack_1050 = fVar138;
  fStack_104c = fVar138;
  local_f88 = fVar143;
  fStack_f84 = fVar143;
  fStack_f80 = fVar143;
  fStack_f7c = fVar143;
  local_f98 = fVar156;
  fStack_f94 = fVar156;
  fStack_f90 = fVar156;
  fStack_f8c = fVar156;
  local_fb8 = fVar149;
  fStack_fb4 = fVar149;
  fStack_fb0 = fVar149;
  fStack_fac = fVar149;
  local_fc8 = fVar139;
  fStack_fc4 = fVar139;
  fStack_fc0 = fVar139;
  fStack_fbc = fVar139;
  fVar157 = fVar156;
  fVar127 = fVar156;
  fVar105 = fVar156;
  fVar107 = fVar149;
  fVar129 = fVar149;
  fVar72 = fVar149;
  fVar83 = fVar139;
  fVar84 = fVar139;
  fVar130 = fVar139;
  fVar95 = fVar144;
  fVar106 = fVar144;
  fVar108 = fVar144;
  fVar109 = fVar126;
  fVar112 = fVar126;
  fVar113 = fVar126;
  fVar114 = fVar138;
  fVar115 = fVar138;
  fVar116 = fVar138;
  fVar119 = fVar147;
  fVar120 = fVar147;
  fVar121 = fVar147;
  fVar122 = fVar135;
  fVar125 = fVar135;
  fVar128 = fVar135;
  fVar136 = fVar143;
  fVar137 = fVar143;
  fVar140 = fVar143;
  fVar142 = fVar141;
  fVar145 = fVar141;
  fVar146 = fVar141;
  do {
    local_1010 = uVar21 + 0x30;
LAB_0058d51e:
    do {
      if (pauVar31 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar15 = pauVar31 + -1;
      pauVar31 = pauVar31 + -1;
    } while (*(float *)&(This->intersector1).intersect <= *(float *)((long)*pauVar15 + 8) &&
             *(float *)((long)*pauVar15 + 8) != *(float *)&(This->intersector1).intersect);
    pRVar22 = *(RayQueryContext **)*pauVar31;
    while (((ulong)pRVar22 & 8) == 0) {
      pfVar6 = (float *)((long)&pRVar22[1].user + uVar30);
      auVar54._0_4_ = (*pfVar6 - fVar139) * fVar144;
      auVar54._4_4_ = (pfVar6[1] - fVar83) * fVar95;
      auVar54._8_4_ = (pfVar6[2] - fVar84) * fVar106;
      auVar54._12_4_ = (pfVar6[3] - fVar130) * fVar108;
      pfVar6 = (float *)((long)&pRVar22[1].user + uVar33);
      auVar111._0_4_ = (*pfVar6 - fVar126) * fVar147;
      auVar111._4_4_ = (pfVar6[1] - fVar109) * fVar119;
      auVar111._8_4_ = (pfVar6[2] - fVar112) * fVar120;
      auVar111._12_4_ = (pfVar6[3] - fVar113) * fVar121;
      auVar54 = maxps(auVar54,auVar111);
      pfVar6 = (float *)((long)&pRVar22[1].user + uVar24);
      auVar118._0_4_ = (*pfVar6 - fVar143) * fVar149;
      auVar118._4_4_ = (pfVar6[1] - fVar136) * fVar107;
      auVar118._8_4_ = (pfVar6[2] - fVar137) * fVar129;
      auVar118._12_4_ = (pfVar6[3] - fVar140) * fVar72;
      auVar73._4_4_ = fVar157;
      auVar73._0_4_ = fVar156;
      auVar73._8_4_ = fVar127;
      auVar73._12_4_ = fVar105;
      auVar73 = maxps(auVar118,auVar73);
      local_1108 = maxps(auVar54,auVar73);
      pfVar6 = (float *)((long)&pRVar22[1].user + uVar32);
      auVar74._0_4_ = (*pfVar6 - fVar139) * fVar135;
      auVar74._4_4_ = (pfVar6[1] - fVar83) * fVar122;
      auVar74._8_4_ = (pfVar6[2] - fVar84) * fVar125;
      auVar74._12_4_ = (pfVar6[3] - fVar130) * fVar128;
      pfVar6 = (float *)((long)&pRVar22[1].user + (uVar33 ^ 0x10));
      auVar85._0_4_ = (*pfVar6 - fVar126) * fVar138;
      auVar85._4_4_ = (pfVar6[1] - fVar109) * fVar114;
      auVar85._8_4_ = (pfVar6[2] - fVar112) * fVar115;
      auVar85._12_4_ = (pfVar6[3] - fVar113) * fVar116;
      auVar73 = minps(auVar74,auVar85);
      pfVar6 = (float *)((long)&pRVar22[1].user + (uVar24 ^ 0x10));
      auVar86._0_4_ = (*pfVar6 - fVar143) * fVar141;
      auVar86._4_4_ = (pfVar6[1] - fVar136) * fVar142;
      auVar86._8_4_ = (pfVar6[2] - fVar137) * fVar145;
      auVar86._12_4_ = (pfVar6[3] - fVar140) * fVar146;
      auVar54 = minps(auVar86,auVar96);
      auVar73 = minps(auVar73,auVar54);
      auVar100._4_4_ = -(uint)(local_1108._4_4_ <= auVar73._4_4_);
      auVar100._0_4_ = -(uint)(local_1108._0_4_ <= auVar73._0_4_);
      auVar100._8_4_ = -(uint)(local_1108._8_4_ <= auVar73._8_4_);
      auVar100._12_4_ = -(uint)(local_1108._12_4_ <= auVar73._12_4_);
      uVar34 = movmskps((int)context,auVar100);
      context = (RayQueryContext *)(ulong)uVar34;
      if (uVar34 == 0) goto LAB_0058d51e;
      uVar18 = (ulong)pRVar22 & 0xfffffffffffffff0;
      lVar28 = 0;
      if ((byte)uVar34 != 0) {
        for (; ((byte)uVar34 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
        }
      }
      pRVar22 = *(RayQueryContext **)(uVar18 + lVar28 * 8);
      uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
      context = pRVar22;
      if (uVar34 != 0) {
        uVar35 = *(uint *)(local_1108 + lVar28 * 4);
        lVar28 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        context = *(RayQueryContext **)(uVar18 + lVar28 * 8);
        uVar39 = *(uint *)(local_1108 + lVar28 * 4);
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 == 0) {
          if (uVar35 < uVar39) {
            *(RayQueryContext **)*pauVar31 = context;
            *(uint *)((long)*pauVar31 + 8) = uVar39;
            context = pRVar22;
            pauVar31 = pauVar31 + 1;
          }
          else {
            *(RayQueryContext **)*pauVar31 = pRVar22;
            *(uint *)((long)*pauVar31 + 8) = uVar35;
            pRVar22 = context;
            pauVar31 = pauVar31 + 1;
          }
        }
        else {
          auVar55._8_4_ = uVar35;
          auVar55._0_8_ = pRVar22;
          auVar55._12_4_ = 0;
          auVar75._8_4_ = uVar39;
          auVar75._0_8_ = context;
          auVar75._12_4_ = 0;
          lVar28 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar18 + lVar28 * 8);
          iVar16 = *(int *)(local_1108 + lVar28 * 4);
          auVar87._8_4_ = iVar16;
          auVar87._0_8_ = uVar19;
          auVar87._12_4_ = 0;
          auVar97._8_4_ = -(uint)((int)uVar35 < (int)uVar39);
          uVar34 = uVar34 - 1 & uVar34;
          fVar109 = fStack_1044;
          fVar112 = fStack_1040;
          fVar113 = fStack_103c;
          fVar126 = local_1048;
          fVar114 = fStack_1054;
          fVar115 = fStack_1050;
          fVar116 = fStack_104c;
          fVar138 = local_1058;
          if (uVar34 == 0) {
            auVar97._4_4_ = auVar97._8_4_;
            auVar97._0_4_ = auVar97._8_4_;
            auVar97._12_4_ = auVar97._8_4_;
            auVar73 = auVar55 & auVar97 | ~auVar97 & auVar75;
            auVar54 = auVar75 & auVar97 | ~auVar97 & auVar55;
            auVar98._8_4_ = -(uint)(auVar73._8_4_ < iVar16);
            auVar98._0_8_ = CONCAT44(auVar98._8_4_,auVar98._8_4_);
            auVar98._12_4_ = auVar98._8_4_;
            pRVar22 = (RayQueryContext *)(~auVar98._0_8_ & uVar19 | auVar73._0_8_ & auVar98._0_8_);
            auVar73 = auVar87 & auVar98 | ~auVar98 & auVar73;
            auVar56._8_4_ = -(uint)(auVar54._8_4_ < auVar73._8_4_);
            auVar56._4_4_ = auVar56._8_4_;
            auVar56._0_4_ = auVar56._8_4_;
            auVar56._12_4_ = auVar56._8_4_;
            *pauVar31 = ~auVar56 & auVar54 | auVar73 & auVar56;
            pauVar31[1] = auVar54 & auVar56 | ~auVar56 & auVar73;
            pauVar31 = pauVar31 + 2;
            context = pRVar22;
          }
          else {
            lVar28 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            iVar9 = *(int *)(local_1108 + lVar28 * 4);
            auVar110._8_4_ = iVar9;
            auVar110._0_8_ = *(undefined8 *)(uVar18 + lVar28 * 8);
            auVar110._12_4_ = 0;
            auVar99._4_4_ = auVar97._8_4_;
            auVar99._0_4_ = auVar97._8_4_;
            auVar99._8_4_ = auVar97._8_4_;
            auVar99._12_4_ = auVar97._8_4_;
            auVar73 = auVar55 & auVar99 | ~auVar99 & auVar75;
            auVar54 = auVar75 & auVar99 | ~auVar99 & auVar55;
            auVar117._0_4_ = -(uint)(iVar16 < iVar9);
            auVar117._4_4_ = -(uint)(iVar16 < iVar9);
            auVar117._8_4_ = -(uint)(iVar16 < iVar9);
            auVar117._12_4_ = -(uint)(iVar16 < iVar9);
            auVar100 = auVar87 & auVar117 | ~auVar117 & auVar110;
            auVar118 = ~auVar117 & auVar87 | auVar110 & auVar117;
            auVar88._8_4_ = -(uint)(auVar54._8_4_ < auVar118._8_4_);
            auVar88._4_4_ = auVar88._8_4_;
            auVar88._0_4_ = auVar88._8_4_;
            auVar88._12_4_ = auVar88._8_4_;
            auVar111 = auVar54 & auVar88 | ~auVar88 & auVar118;
            auVar76._8_4_ = -(uint)(auVar73._8_4_ < auVar100._8_4_);
            auVar76._0_8_ = CONCAT44(auVar76._8_4_,auVar76._8_4_);
            auVar76._12_4_ = auVar76._8_4_;
            pRVar22 = (RayQueryContext *)
                      (auVar73._0_8_ & auVar76._0_8_ | ~auVar76._0_8_ & auVar100._0_8_);
            auVar73 = ~auVar76 & auVar73 | auVar100 & auVar76;
            auVar57._8_4_ = -(uint)(auVar73._8_4_ < auVar111._8_4_);
            auVar57._4_4_ = auVar57._8_4_;
            auVar57._0_4_ = auVar57._8_4_;
            auVar57._12_4_ = auVar57._8_4_;
            *pauVar31 = ~auVar88 & auVar54 | auVar118 & auVar88;
            pauVar31[1] = ~auVar57 & auVar73 | auVar111 & auVar57;
            pauVar31[2] = auVar73 & auVar57 | ~auVar57 & auVar111;
            pauVar31 = pauVar31 + 3;
            context = pRVar22;
            fVar147 = local_ff8;
            fVar119 = fStack_ff4;
            fVar120 = fStack_ff0;
            fVar121 = fStack_fec;
            fVar135 = local_1008;
            fVar122 = fStack_1004;
            fVar125 = fStack_1000;
            fVar128 = fStack_ffc;
          }
        }
      }
    }
    if (((uint)pRVar22 & 0xf) == 8) {
      uVar18 = (ulong)*(uint *)(uVar21 + 0xc);
      lVar23 = (ulong)*(uint *)(uVar21 + 0x24) + local_1010;
      lVar28 = lVar23 + ((ulong)pRVar22 >> 4) * 4;
      pfVar6 = (float *)(lVar23 + -4 + ((ulong)pRVar22 >> 4) * 4);
      local_1218._4_4_ = pfVar6[1];
      pfVar7 = (float *)(lVar28 + -4 + uVar18 * 4);
      fVar156 = pfVar7[1];
      fVar157 = pfVar7[2];
      uStack_1210._4_4_ = pfVar6[2];
      if (uVar18 == 2) {
        fVar157 = fVar156;
        uStack_1210._4_4_ = (float)local_1218._4_4_;
      }
      uVar19 = (ulong)*(uint *)(uVar21 + 0x14);
      pfVar2 = (float *)(lVar28 + uVar19 * 4);
      fVar139 = *pfVar2;
      pfVar3 = pfVar2 + -1 + uVar18;
      fVar126 = pfVar3[1];
      fVar143 = pfVar2[1];
      fVar127 = pfVar3[2];
      if (uVar18 == 2) {
        fVar143 = fVar139;
        fVar127 = fVar126;
      }
      pfVar4 = (float *)(lVar28 + uVar19 * 8);
      context = (RayQueryContext *)(pfVar4 + -1);
      fVar105 = *pfVar4;
      pfVar5 = (float *)((long)&context->scene + uVar18 * 4);
      fVar149 = pfVar5[1];
      fVar107 = pfVar4[1];
      fVar129 = pfVar5[2];
      if (uVar18 == 2) {
        fVar107 = fVar105;
        fVar129 = fVar149;
      }
      fVar72 = *(float *)&This->ptr;
      fVar83 = *(float *)((long)&This->ptr + 4);
      fVar84 = *(float *)&This->leafIntersector;
      local_1028 = *(float *)&(This->collider).collide;
      fVar130 = *(float *)((long)&(This->collider).collide + 4);
      fStack_1230 = *(float *)&(This->collider).name;
      fVar116 = *pfVar6 - fVar72;
      fVar119 = *pfVar7 - fVar72;
      fStack_1140 = (float)local_1218._4_4_ - fVar72;
      fStack_113c = fVar156 - fVar72;
      fVar108 = pfVar2[-1] - fVar83;
      fVar112 = *pfVar3 - fVar83;
      fStack_1150 = fVar139 - fVar83;
      fStack_114c = fVar126 - fVar83;
      local_1158 = CONCAT44(fVar112,fVar108);
      local_11f8._0_4_ = *(float *)&context->scene - fVar84;
      local_11f8._4_4_ = *pfVar5 - fVar84;
      fStack_11f0 = fVar105 - fVar84;
      fStack_11ec = fVar149 - fVar84;
      local_1218._0_4_ = (float)local_1218._4_4_ - fVar72;
      local_1218._4_4_ = (float)local_1218._4_4_ - fVar72;
      uStack_1210._0_4_ = uStack_1210._4_4_ - fVar72;
      uStack_1210._4_4_ = uStack_1210._4_4_ - fVar72;
      fVar136 = fVar139 - fVar83;
      fVar139 = fVar139 - fVar83;
      fVar142 = fVar143 - fVar83;
      fVar143 = fVar143 - fVar83;
      fVar95 = fVar105 - fVar84;
      fVar105 = fVar105 - fVar84;
      fVar106 = fVar107 - fVar84;
      fVar107 = fVar107 - fVar84;
      fVar154 = *pfVar7 - fVar72;
      fVar155 = fVar156 - fVar72;
      fVar156 = fVar156 - fVar72;
      fVar157 = fVar157 - fVar72;
      fVar122 = *pfVar3 - fVar83;
      fVar125 = fVar126 - fVar83;
      fVar126 = fVar126 - fVar83;
      fVar127 = fVar127 - fVar83;
      fVar128 = *pfVar5 - fVar84;
      fVar135 = fVar149 - fVar84;
      fVar149 = fVar149 - fVar84;
      fVar129 = fVar129 - fVar84;
      fVar145 = fVar154 - fVar116;
      fVar141 = fVar155 - fVar119;
      fVar150 = fVar156 - fStack_1140;
      fVar152 = fVar157 - fStack_113c;
      fVar137 = fVar122 - fVar108;
      fVar140 = fVar125 - fVar112;
      fStack_1200 = fVar126 - fStack_1150;
      fStack_11fc = fVar127 - fStack_114c;
      fVar158 = fVar128 - (float)local_11f8._0_4_;
      fVar160 = fVar135 - (float)local_11f8._4_4_;
      fStack_11d0 = fVar149 - fStack_11f0;
      fStack_11cc = fVar129 - fStack_11ec;
      local_11d8 = CONCAT44(fVar160,fVar158);
      local_1208 = (Scene *)CONCAT44(fVar140,fVar137);
      local_1228._4_4_ = fVar141;
      local_1228._0_4_ = fVar145;
      uStack_1220._0_4_ = fVar150;
      uStack_1220._4_4_ = fVar152;
      local_1238 = (RayQueryContext *)CONCAT44(fStack_1230,fStack_1230);
      fStack_122c = fStack_1230;
      fVar72 = fVar108 - fVar136;
      fVar83 = fVar112 - fVar139;
      fVar84 = fStack_1150 - fVar142;
      fVar144 = fStack_114c - fVar143;
      fVar164 = (fVar137 * (fVar128 + (float)local_11f8._0_4_) - fVar158 * (fVar122 + fVar108)) *
                local_1028 +
                (fVar158 * (fVar154 + fVar116) - (fVar128 + (float)local_11f8._0_4_) * fVar145) *
                fVar130 + ((fVar122 + fVar108) * fVar145 - (fVar154 + fVar116) * fVar137) *
                          fStack_1230;
      fVar167 = (fVar140 * (fVar135 + (float)local_11f8._4_4_) - fVar160 * (fVar125 + fVar112)) *
                local_1028 +
                (fVar160 * (fVar155 + fVar119) - (fVar135 + (float)local_11f8._4_4_) * fVar141) *
                fVar130 + ((fVar125 + fVar112) * fVar141 - (fVar155 + fVar119) * fVar140) *
                          fStack_1230;
      local_1228 = (undefined1  [8])CONCAT44(fVar167,fVar164);
      uStack_1220._0_4_ =
           (fStack_1200 * (fVar149 + fStack_11f0) - fStack_11d0 * (fVar126 + fStack_1150)) *
           local_1028 +
           (fStack_11d0 * (fVar156 + fStack_1140) - (fVar149 + fStack_11f0) * fVar150) * fVar130 +
           ((fVar126 + fStack_1150) * fVar150 - (fVar156 + fStack_1140) * fStack_1200) * fStack_1230
      ;
      uStack_1220._4_4_ =
           (fStack_11fc * (fVar129 + fStack_11ec) - fStack_11cc * (fVar127 + fStack_114c)) *
           local_1028 +
           (fStack_11cc * (fVar157 + fStack_113c) - (fVar129 + fStack_11ec) * fVar152) * fVar130 +
           ((fVar127 + fStack_114c) * fVar152 - (fVar157 + fStack_113c) * fStack_11fc) * fStack_1230
      ;
      fVar146 = (float)local_11f8._0_4_ - fVar95;
      fVar148 = (float)local_11f8._4_4_ - fVar105;
      fVar151 = fStack_11f0 - fVar106;
      fVar153 = fStack_11ec - fVar107;
      fVar109 = fVar116 - (float)local_1218._0_4_;
      fVar113 = fVar119 - (float)local_1218._4_4_;
      fVar114 = fStack_1140 - (float)uStack_1210;
      fVar115 = fStack_113c - uStack_1210._4_4_;
      local_1148 = CONCAT44(fVar119,fVar116);
      auVar131._0_4_ =
           (fVar72 * ((float)local_11f8._0_4_ + fVar95) - fVar146 * (fVar108 + fVar136)) *
           local_1028 +
           (fVar146 * (fVar116 + (float)local_1218._0_4_) -
           ((float)local_11f8._0_4_ + fVar95) * fVar109) * fVar130 +
           ((fVar108 + fVar136) * fVar109 - (fVar116 + (float)local_1218._0_4_) * fVar72) *
           fStack_1230;
      auVar131._4_4_ =
           (fVar83 * ((float)local_11f8._4_4_ + fVar105) - fVar148 * (fVar112 + fVar139)) *
           local_1028 +
           (fVar148 * (fVar119 + (float)local_1218._4_4_) -
           ((float)local_11f8._4_4_ + fVar105) * fVar113) * fVar130 +
           ((fVar112 + fVar139) * fVar113 - (fVar119 + (float)local_1218._4_4_) * fVar83) *
           fStack_1230;
      auVar131._8_4_ =
           (fVar84 * (fStack_11f0 + fVar106) - fVar151 * (fStack_1150 + fVar142)) * local_1028 +
           (fVar151 * (fStack_1140 + (float)uStack_1210) - (fStack_11f0 + fVar106) * fVar114) *
           fVar130 + ((fStack_1150 + fVar142) * fVar114 -
                     (fStack_1140 + (float)uStack_1210) * fVar84) * fStack_1230;
      auVar131._12_4_ =
           (fVar144 * (fStack_11ec + fVar107) - fVar153 * (fStack_114c + fVar143)) * local_1028 +
           (fVar153 * (fStack_113c + uStack_1210._4_4_) - (fStack_11ec + fVar107) * fVar115) *
           fVar130 + ((fStack_114c + fVar143) * fVar115 -
                     (fStack_113c + uStack_1210._4_4_) * fVar144) * fStack_1230;
      local_1248._0_4_ = (float)local_1218._0_4_ - fVar154;
      local_1248._4_4_ = (float)local_1218._4_4_ - fVar155;
      fStack_1240 = (float)uStack_1210 - fVar156;
      fStack_123c = uStack_1210._4_4_ - fVar157;
      fVar159 = fVar136 - fVar122;
      fVar161 = fVar139 - fVar125;
      fVar162 = fVar142 - fVar126;
      fVar163 = fVar143 - fVar127;
      fVar138 = fVar95 - fVar128;
      fVar120 = fVar105 - fVar135;
      fVar121 = fVar106 - fVar149;
      fVar147 = fVar107 - fVar129;
      auVar89._0_4_ =
           (fVar159 * (fVar128 + fVar95) - fVar138 * (fVar122 + fVar136)) * local_1028 +
           (fVar138 * (fVar154 + (float)local_1218._0_4_) -
           (fVar128 + fVar95) * (float)local_1248._0_4_) * fVar130 +
           ((fVar122 + fVar136) * (float)local_1248._0_4_ -
           (fVar154 + (float)local_1218._0_4_) * fVar159) * fStack_1230;
      auVar89._4_4_ =
           (fVar161 * (fVar135 + fVar105) - fVar120 * (fVar125 + fVar139)) * local_1028 +
           (fVar120 * (fVar155 + (float)local_1218._4_4_) -
           (fVar135 + fVar105) * (float)local_1248._4_4_) * fVar130 +
           ((fVar125 + fVar139) * (float)local_1248._4_4_ -
           (fVar155 + (float)local_1218._4_4_) * fVar161) * fStack_1230;
      auVar89._8_4_ =
           (fVar162 * (fVar149 + fVar106) - fVar121 * (fVar126 + fVar142)) * local_1028 +
           (fVar121 * (fVar156 + (float)uStack_1210) - (fVar149 + fVar106) * fStack_1240) * fVar130
           + ((fVar126 + fVar142) * fStack_1240 - (fVar156 + (float)uStack_1210) * fVar162) *
             fStack_1230;
      auVar89._12_4_ =
           (fVar163 * (fVar129 + fVar107) - fVar147 * (fVar127 + fVar143)) * local_1028 +
           (fVar147 * (fVar157 + uStack_1210._4_4_) - (fVar129 + fVar107) * fStack_123c) * fVar130 +
           ((fVar127 + fVar143) * fStack_123c - (fVar157 + uStack_1210._4_4_) * fVar163) *
           fStack_1230;
      local_1168 = fVar164 + auVar131._0_4_ + auVar89._0_4_;
      fStack_1164 = fVar167 + auVar131._4_4_ + auVar89._4_4_;
      fStack_1160 = (float)uStack_1220 + auVar131._8_4_ + auVar89._8_4_;
      fStack_115c = uStack_1220._4_4_ + auVar131._12_4_ + auVar89._12_4_;
      auVar123._8_4_ = (float)uStack_1220;
      auVar123._0_8_ = local_1228;
      auVar123._12_4_ = uStack_1220._4_4_;
      auVar96 = minps(auVar123,auVar131);
      auVar73 = minps(auVar96,auVar89);
      auVar101._8_4_ = (float)uStack_1220;
      auVar101._0_8_ = local_1228;
      auVar101._12_4_ = uStack_1220._4_4_;
      auVar96 = maxps(auVar101,auVar131);
      auVar96 = maxps(auVar96,auVar89);
      local_1038 = ABS(local_1168);
      fStack_1034 = ABS(fStack_1164);
      fStack_1030 = ABS(fStack_1160);
      fStack_102c = ABS(fStack_115c);
      uVar27 = (ulong)*(uint *)(uVar21 + 0x10);
      puVar20 = (uint *)(uVar19 * 0xc + lVar28);
      local_11b0 = (float *)(puVar20 + -1);
      local_11a8 = uVar18;
      local_11a0 = uVar27;
      auVar102._0_4_ =
           -(uint)(auVar96._0_4_ <= local_1038 * 1.1920929e-07 ||
                  -(local_1038 * 1.1920929e-07) <= auVar73._0_4_) & local_fe8;
      auVar102._4_4_ =
           -(uint)(auVar96._4_4_ <= fStack_1034 * 1.1920929e-07 ||
                  -(fStack_1034 * 1.1920929e-07) <= auVar73._4_4_) & uStack_fe4;
      auVar102._8_4_ =
           -(uint)(auVar96._8_4_ <= fStack_1030 * 1.1920929e-07 ||
                  -(fStack_1030 * 1.1920929e-07) <= auVar73._8_4_) & uStack_fe0;
      auVar102._12_4_ =
           -(uint)(auVar96._12_4_ <= fStack_102c * 1.1920929e-07 ||
                  -(fStack_102c * 1.1920929e-07) <= auVar73._12_4_) & uStack_fdc;
      iVar16 = movmskps((int)local_11b0,auVar102);
      if (iVar16 != 0) {
        _local_1218 = auVar131;
        fStack_1024 = local_1028;
        fStack_1020 = local_1028;
        fStack_101c = local_1028;
        uVar34 = -(uint)(ABS(fVar146 * fVar159) <= ABS(fVar158 * fVar72));
        uVar36 = -(uint)(ABS(fVar148 * fVar161) <= ABS(fVar160 * fVar83));
        uVar40 = -(uint)(ABS(fVar151 * fVar162) <= ABS(fStack_11d0 * fVar84));
        uVar43 = -(uint)(ABS(fVar153 * fVar163) <= ABS(fStack_11cc * fVar144));
        uVar35 = -(uint)(ABS(fVar109 * fVar138) <= ABS(fVar145 * fVar146));
        uVar37 = -(uint)(ABS(fVar113 * fVar120) <= ABS(fVar141 * fVar148));
        uVar41 = -(uint)(ABS(fVar114 * fVar121) <= ABS(fVar150 * fVar151));
        uVar44 = -(uint)(ABS(fVar115 * fVar147) <= ABS(fVar152 * fVar153));
        uVar39 = -(uint)(ABS(fVar72 * (float)local_1248._0_4_) <= ABS(fVar137 * fVar109));
        uVar38 = -(uint)(ABS(fVar83 * (float)local_1248._4_4_) <= ABS(fVar140 * fVar113));
        uVar42 = -(uint)(ABS(fVar84 * fStack_1240) <= ABS(fStack_1200 * fVar114));
        uVar45 = -(uint)(ABS(fVar144 * fStack_123c) <= ABS(fStack_11fc * fVar115));
        local_1088[0] =
             (float)(~uVar34 & (uint)(fVar137 * fVar146 - fVar158 * fVar72) |
                    (uint)(fVar72 * fVar138 - fVar146 * fVar159) & uVar34);
        local_1088[1] =
             (float)(~uVar36 & (uint)(fVar140 * fVar148 - fVar160 * fVar83) |
                    (uint)(fVar83 * fVar120 - fVar148 * fVar161) & uVar36);
        local_1088[2] =
             (float)(~uVar40 & (uint)(fStack_1200 * fVar151 - fStack_11d0 * fVar84) |
                    (uint)(fVar84 * fVar121 - fVar151 * fVar162) & uVar40);
        local_1088[3] =
             (float)(~uVar43 & (uint)(fStack_11fc * fVar153 - fStack_11cc * fVar144) |
                    (uint)(fVar144 * fVar147 - fVar153 * fVar163) & uVar43);
        local_1078[0] =
             (float)(~uVar35 & (uint)(fVar158 * fVar109 - fVar145 * fVar146) |
                    (uint)(fVar146 * (float)local_1248._0_4_ - fVar109 * fVar138) & uVar35);
        local_1078[1] =
             (float)(~uVar37 & (uint)(fVar160 * fVar113 - fVar141 * fVar148) |
                    (uint)(fVar148 * (float)local_1248._4_4_ - fVar113 * fVar120) & uVar37);
        local_1078[2] =
             (float)(~uVar41 & (uint)(fStack_11d0 * fVar114 - fVar150 * fVar151) |
                    (uint)(fVar151 * fStack_1240 - fVar114 * fVar121) & uVar41);
        local_1078[3] =
             (float)(~uVar44 & (uint)(fStack_11cc * fVar115 - fVar152 * fVar153) |
                    (uint)(fVar153 * fStack_123c - fVar115 * fVar147) & uVar44);
        local_10e8._4_4_ = fStack_1164;
        local_10e8._0_4_ = local_1168;
        local_10e8._8_4_ = fStack_1160;
        local_10e8._12_4_ = fStack_115c;
        local_1068[0] =
             (float)(~uVar39 & (uint)(fVar145 * fVar72 - fVar137 * fVar109) |
                    (uint)(fVar109 * fVar159 - fVar72 * (float)local_1248._0_4_) & uVar39);
        local_1068[1] =
             (float)(~uVar38 & (uint)(fVar141 * fVar83 - fVar140 * fVar113) |
                    (uint)(fVar113 * fVar161 - fVar83 * (float)local_1248._4_4_) & uVar38);
        local_1068[2] =
             (float)(~uVar42 & (uint)(fVar150 * fVar84 - fStack_1200 * fVar114) |
                    (uint)(fVar114 * fVar162 - fVar84 * fStack_1240) & uVar42);
        local_1068[3] =
             (float)(~uVar45 & (uint)(fVar152 * fVar144 - fStack_11fc * fVar115) |
                    (uint)(fVar115 * fVar163 - fVar144 * fStack_123c) & uVar45);
        fVar156 = local_1028 * local_1088[0] + fVar130 * local_1078[0] + fStack_1230 * local_1068[0]
        ;
        fVar157 = local_1028 * local_1088[1] + fVar130 * local_1078[1] + fStack_1230 * local_1068[1]
        ;
        fVar139 = local_1028 * local_1088[2] + fVar130 * local_1078[2] + fStack_1230 * local_1068[2]
        ;
        fVar126 = local_1028 * local_1088[3] + fVar130 * local_1078[3] + fStack_1230 * local_1068[3]
        ;
        auVar46._0_4_ = fVar156 + fVar156;
        auVar46._4_4_ = fVar157 + fVar157;
        auVar46._8_4_ = fVar139 + fVar139;
        auVar46._12_4_ = fVar126 + fVar126;
        auVar58._0_4_ = (float)local_11f8._0_4_ * local_1068[0];
        auVar58._4_4_ = (float)local_11f8._4_4_ * local_1068[1];
        auVar58._8_4_ = fStack_11f0 * local_1068[2];
        auVar58._12_4_ = fStack_11ec * local_1068[3];
        fVar139 = fVar116 * local_1088[0] + fVar108 * local_1078[0] + auVar58._0_4_;
        fVar126 = fVar119 * local_1088[1] + fVar112 * local_1078[1] + auVar58._4_4_;
        fVar105 = fStack_1140 * local_1088[2] + fStack_1150 * local_1078[2] + auVar58._8_4_;
        fVar149 = fStack_113c * local_1088[3] + fStack_114c * local_1078[3] + auVar58._12_4_;
        auVar96 = rcpps(auVar58,auVar46);
        fVar156 = auVar96._0_4_;
        fVar157 = auVar96._4_4_;
        fVar143 = auVar96._8_4_;
        fVar127 = auVar96._12_4_;
        fVar139 = ((1.0 - auVar46._0_4_ * fVar156) * fVar156 + fVar156) * (fVar139 + fVar139);
        fVar126 = ((1.0 - auVar46._4_4_ * fVar157) * fVar157 + fVar157) * (fVar126 + fVar126);
        fVar143 = ((1.0 - auVar46._8_4_ * fVar143) * fVar143 + fVar143) * (fVar105 + fVar105);
        fVar127 = ((1.0 - auVar46._12_4_ * fVar127) * fVar127 + fVar127) * (fVar149 + fVar149);
        pIVar1 = &This->intersector1;
        fVar156 = *(float *)&pIVar1->intersect;
        fVar157 = *(float *)((long)&This->leafIntersector + 4);
        bVar13 = fVar139 <= fVar156 && fVar157 <= fVar139;
        auVar77._0_4_ = -(uint)bVar13;
        bVar14 = fVar126 <= fVar156 && fVar157 <= fVar126;
        auVar77._4_4_ = -(uint)bVar14;
        bVar12 = fVar143 <= fVar156 && fVar157 <= fVar143;
        auVar77._8_4_ = -(uint)bVar12;
        bVar11 = fVar127 <= fVar156 && fVar157 <= fVar127;
        auVar77._12_4_ = -(uint)bVar11;
        auVar47._0_4_ = (int)((uint)(auVar46._0_4_ != 0.0 && bVar13) * -0x80000000) >> 0x1f;
        auVar47._4_4_ = (int)((uint)(auVar46._4_4_ != 0.0 && bVar14) * -0x80000000) >> 0x1f;
        auVar47._8_4_ = (int)((uint)(auVar46._8_4_ != 0.0 && bVar12) * -0x80000000) >> 0x1f;
        auVar47._12_4_ = (int)((uint)(auVar46._12_4_ != 0.0 && bVar11) * -0x80000000) >> 0x1f;
        auVar48 = auVar47 & auVar102;
        iVar16 = movmskps(iVar16,auVar48);
        if (iVar16 != 0) {
          uVar34 = *(uint *)(uVar21 + 0x18);
          uVar26 = *(undefined4 *)(uVar21 + 0x1c);
          local_1108 = _local_1228;
          local_10f8 = auVar131._0_4_;
          fStack_10f4 = auVar131._4_4_;
          fStack_10f0 = auVar131._8_4_;
          fStack_10ec = auVar131._12_4_;
          local_10d8 = &local_11b0;
          local_10c8 = auVar48;
          local_1098[0] = fVar139;
          local_1098[1] = fVar126;
          local_1098[2] = fVar143;
          local_1098[3] = fVar127;
          context = *(RayQueryContext **)
                     (*(long *)(*(long *)&(ray->super_RayK<1>).org.field_0 + 0x1e8) +
                     (ulong)uVar34 * 8);
          local_1238 = context;
          if (((uint)*(float *)((long)&context[2].scene + 4) &
              *(uint *)((long)&(This->intersector1).intersect + 4)) != 0) {
            local_11c8 = auVar48;
            uVar35 = *puVar20;
            pfVar6 = local_11b0 + uVar18;
            fVar156 = *pfVar6;
            fVar157 = pfVar6[1];
            uVar39 = puVar20[1];
            fVar105 = pfVar6[2];
            if (uVar18 == 2) {
              uVar39 = uVar35;
              fVar105 = fVar157;
            }
            auVar96 = rcpps(auVar77,local_10e8);
            fVar149 = auVar96._0_4_;
            fVar107 = auVar96._4_4_;
            fVar129 = auVar96._8_4_;
            fVar72 = auVar96._12_4_;
            fVar149 = (float)(-(uint)(1e-18 <= local_1038) &
                             (uint)(((float)DAT_01f46a60 - local_1168 * fVar149) * fVar149 + fVar149
                                   ));
            fVar107 = (float)(-(uint)(1e-18 <= fStack_1034) &
                             (uint)((DAT_01f46a60._4_4_ - fStack_1164 * fVar107) * fVar107 + fVar107
                                   ));
            fVar129 = (float)(-(uint)(1e-18 <= fStack_1030) &
                             (uint)((DAT_01f46a60._8_4_ - fStack_1160 * fVar129) * fVar129 + fVar129
                                   ));
            fVar72 = (float)(-(uint)(1e-18 <= fStack_102c) &
                            (uint)((DAT_01f46a60._12_4_ - fStack_115c * fVar72) * fVar72 + fVar72));
            auVar165._0_4_ = fVar164 * fVar149;
            auVar165._4_4_ = fVar167 * fVar107;
            auVar165._8_4_ = (float)uStack_1220 * fVar129;
            auVar165._12_4_ = uStack_1220._4_4_ * fVar72;
            auVar73 = minps(auVar165,_DAT_01f46a60);
            auVar132._0_4_ = auVar131._0_4_ * fVar149;
            auVar132._4_4_ = auVar131._4_4_ * fVar107;
            auVar132._8_4_ = auVar131._8_4_ * fVar129;
            auVar132._12_4_ = auVar131._12_4_ * fVar72;
            auVar96 = minps(auVar132,_DAT_01f46a60);
            fVar95 = auVar73._0_4_;
            fVar106 = auVar73._4_4_;
            fVar108 = auVar73._8_4_;
            fVar109 = auVar73._12_4_;
            fVar83 = auVar96._0_4_;
            fVar84 = auVar96._4_4_;
            fVar130 = auVar96._8_4_;
            fVar144 = auVar96._12_4_;
            fVar149 = ((float)DAT_01f46a60 - fVar95) - fVar83;
            fVar107 = (DAT_01f46a60._4_4_ - fVar106) - fVar84;
            fVar129 = (DAT_01f46a60._8_4_ - fVar108) - fVar130;
            fVar72 = (DAT_01f46a60._12_4_ - fVar109) - fVar144;
            local_10b8[0] =
                 (float)((uint)*local_11b0 & 0xffff) * 0.00012207031 * fVar149 +
                 (float)((uint)fVar156 & 0xffff) * 0.00012207031 * fVar83 +
                 (float)(uVar35 & 0xffff) * 0.00012207031 * fVar95;
            local_10b8[1] =
                 (float)((uint)fVar156 & 0xffff) * 0.00012207031 * fVar107 +
                 (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar84 +
                 (float)(uVar35 & 0xffff) * 0.00012207031 * fVar106;
            local_10b8[2] =
                 (float)(uVar35 & 0xffff) * 0.00012207031 * fVar129 +
                 (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar130 +
                 (float)(uVar39 & 0xffff) * 0.00012207031 * fVar108;
            local_10b8[3] =
                 (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar72 +
                 (float)((uint)fVar105 & 0xffff) * 0.00012207031 * fVar144 +
                 (float)(uVar39 & 0xffff) * 0.00012207031 * fVar109;
            local_10a8[0] =
                 fVar149 * (float)((uint)*local_11b0 >> 0x10) * 0.00012207031 +
                 (float)((uint)fVar156 >> 0x10) * 0.00012207031 * fVar83 +
                 (float)(uVar35 >> 0x10) * 0.00012207031 * fVar95;
            local_10a8[1] =
                 fVar107 * (float)((uint)fVar156 >> 0x10) * 0.00012207031 +
                 (float)((uint)fVar157 >> 0x10) * 0.00012207031 * fVar84 +
                 (float)(uVar35 >> 0x10) * 0.00012207031 * fVar106;
            local_10a8[2] =
                 fVar129 * (float)(uVar35 >> 0x10) * 0.00012207031 +
                 (float)((uint)fVar157 >> 0x10) * 0.00012207031 * fVar130 +
                 (float)(uVar39 >> 0x10) * 0.00012207031 * fVar108;
            local_10a8[3] =
                 fVar72 * (float)((uint)fVar157 >> 0x10) * 0.00012207031 +
                 (float)((uint)fVar105 >> 0x10) * 0.00012207031 * fVar144 +
                 (float)(uVar39 >> 0x10) * 0.00012207031 * fVar109;
            uVar35 = auVar48._0_4_;
            uVar39 = auVar48._4_4_;
            uVar36 = auVar48._8_4_;
            uVar37 = auVar48._12_4_;
            auVar59._0_4_ = uVar35 & (uint)fVar139;
            auVar59._4_4_ = uVar39 & (uint)fVar126;
            auVar59._8_4_ = uVar36 & (uint)fVar143;
            auVar59._12_4_ = uVar37 & (uint)fVar127;
            auVar78._0_8_ = CONCAT44(~uVar39,~uVar35) & 0x7f8000007f800000;
            auVar78._8_4_ = ~uVar36 & 0x7f800000;
            auVar78._12_4_ = ~uVar37 & 0x7f800000;
            auVar78 = auVar78 | auVar59;
            auVar90._4_4_ = auVar78._0_4_;
            auVar90._0_4_ = auVar78._4_4_;
            auVar90._8_4_ = auVar78._12_4_;
            auVar90._12_4_ = auVar78._8_4_;
            auVar96 = minps(auVar90,auVar78);
            auVar60._0_8_ = auVar96._8_8_;
            auVar60._8_4_ = auVar96._0_4_;
            auVar60._12_4_ = auVar96._4_4_;
            auVar96 = minps(auVar60,auVar96);
            auVar61._0_8_ =
                 CONCAT44(-(uint)(auVar96._4_4_ == auVar78._4_4_) & uVar39,
                          -(uint)(auVar96._0_4_ == auVar78._0_4_) & uVar35);
            auVar61._8_4_ = -(uint)(auVar96._8_4_ == auVar78._8_4_) & uVar36;
            auVar61._12_4_ = -(uint)(auVar96._12_4_ == auVar78._12_4_) & uVar37;
            iVar16 = movmskps((int)local_11b0,auVar61);
            if (iVar16 != 0) {
              auVar48._8_4_ = auVar61._8_4_;
              auVar48._0_8_ = auVar61._0_8_;
              auVar48._12_4_ = auVar61._12_4_;
            }
            uVar17 = movmskps(iVar16,auVar48);
            uVar19 = CONCAT44((int)((ulong)local_11b0 >> 0x20),uVar17);
            lVar23 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            local_1218 = *(undefined1 (*) [8])&(ray->super_RayK<1>).dir.field_0;
            uStack_1210 = auVar131._8_8_;
            if ((*(long *)((long)local_1218 + 0x10) == 0) &&
               (context[2].args == (RTCIntersectArguments *)0x0)) {
              fVar156 = local_10b8[lVar23];
              fVar157 = local_10a8[lVar23];
              fVar139 = local_1088[lVar23];
              fVar126 = local_1078[lVar23];
              fVar143 = local_1068[lVar23];
              *(float *)&(This->intersector1).intersect = local_1098[lVar23];
              *(float *)&(This->intersector1).pointQuery = fVar139;
              *(float *)((long)&(This->intersector1).pointQuery + 4) = fVar126;
              *(float *)&(This->intersector1).name = fVar143;
              *(float *)((long)&(This->intersector1).name + 4) = fVar156;
              *(float *)&(This->intersector4).intersect = fVar157;
              *(undefined4 *)((long)&(This->intersector4).intersect + 4) = uVar26;
              *(uint *)&(This->intersector4).occluded = uVar34;
              puVar20 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
              uVar34 = *puVar20;
              context = (RayQueryContext *)(ulong)uVar34;
              *(uint *)((long)&(This->intersector4).occluded + 4) = uVar34;
              *(uint *)&(This->intersector4).name = puVar20[1];
            }
            else {
              local_11f8 = (undefined1  [8])pIVar1->intersect;
              _fStack_11f0 = pIVar1->occluded;
              local_1228 = (undefined1  [8])
                           *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
              local_1208 = (Scene *)uVar18;
              local_1148 = uVar27;
              local_1158 = lVar28;
              local_1168 = fVar139;
              fStack_1164 = fVar126;
              fStack_1160 = fVar143;
              fStack_115c = fVar127;
              local_11d8 = (ulong)uVar34;
LAB_0058e773:
              local_112c = local_10b8[lVar23];
              local_1128 = local_10a8[lVar23];
              *(float *)&(This->intersector1).intersect = local_1098[lVar23];
              local_1248 = (undefined1  [8])lVar23;
              local_1138 = local_1088[lVar23];
              local_1134 = local_1078[lVar23];
              local_1130 = local_1068[lVar23];
              local_1124 = uVar26;
              local_1120 = (int)local_11d8;
              local_111c = (float)*(undefined4 *)local_1228;
              local_1118 = (float)*(undefined4 *)((long)local_1228 + 4);
              local_124c = -1;
              local_1198 = &local_124c;
              local_1190 = local_1238[1].scene;
              local_1188 = (RayQueryContext *)local_1228;
              local_1180 = This;
              local_1178 = &local_1138;
              local_1170 = 1;
              if ((local_1238[2].args == (RTCIntersectArguments *)0x0) ||
                 (context = local_1238, (*(code *)local_1238[2].args)(&local_1198),
                 This = local_11e0, uVar18 = (ulong)local_1208, uVar27 = local_1148,
                 lVar28 = local_1158, uVar30 = local_11e8, fVar139 = local_1168,
                 fVar126 = fStack_1164, fVar143 = fStack_1160, fVar127 = fStack_115c,
                 *local_1198 != 0)) {
                if ((*(RTCIntersectArguments **)((long)local_1218 + 0x10) !=
                     (RTCIntersectArguments *)0x0) &&
                   (((context = (RayQueryContext *)local_1218,
                     ((ulong)*(Scene **)local_1218 & 2) != 0 ||
                     (context = local_1238, ((ulong)local_1238[2].user & 0x40000000000000) != 0)) &&
                    ((*(code *)*(RTCIntersectArguments **)((long)local_1218 + 0x10))(&local_1198),
                    This = local_11e0, uVar18 = (ulong)local_1208, uVar27 = local_1148,
                    lVar28 = local_1158, uVar30 = local_11e8, fVar139 = local_1168,
                    fVar126 = fStack_1164, fVar143 = fStack_1160, fVar127 = fStack_115c,
                    *local_1198 == 0)))) goto LAB_0058e975;
                *(float *)&(local_1180->intersector1).pointQuery = *local_1178;
                *(float *)((long)&(local_1180->intersector1).pointQuery + 4) = local_1178[1];
                *(float *)&(local_1180->intersector1).name = local_1178[2];
                *(float *)((long)&(local_1180->intersector1).name + 4) = local_1178[3];
                *(float *)&(local_1180->intersector4).intersect = local_1178[4];
                *(float *)((long)&(local_1180->intersector4).intersect + 4) = local_1178[5];
                *(float *)&(local_1180->intersector4).occluded = local_1178[6];
                *(float *)((long)&(local_1180->intersector4).occluded + 4) = local_1178[7];
                context = (RayQueryContext *)(ulong)(uint)local_1178[8];
                *(float *)&(local_1180->intersector4).name = local_1178[8];
              }
              else {
LAB_0058e975:
                *(undefined4 *)&(local_11e0->intersector1).intersect = local_11f8._0_4_;
                This = local_11e0;
                uVar18 = (ulong)local_1208;
                uVar27 = local_1148;
                lVar28 = local_1158;
                uVar30 = local_11e8;
                fVar139 = local_1168;
                fVar126 = fStack_1164;
                fVar143 = fStack_1160;
                fVar127 = fStack_115c;
              }
              *(undefined4 *)(local_11c8 + (long)local_1248 * 4) = 0;
              local_11f8 = (undefined1  [8])(This->intersector1).intersect;
              _fStack_11f0 = (This->intersector1).occluded;
              fVar156 = SUB84(local_11f8,0);
              auVar52._0_4_ = -(uint)(fVar139 <= fVar156) & local_11c8._0_4_;
              auVar52._4_4_ = -(uint)(fVar126 <= fVar156) & local_11c8._4_4_;
              auVar52._8_4_ = -(uint)(fVar143 <= fVar156) & local_11c8._8_4_;
              auVar52._12_4_ = -(uint)(fVar127 <= fVar156) & local_11c8._12_4_;
              local_11c8 = auVar52;
              iVar16 = movmskps(local_1248._0_4_,auVar52);
              if (iVar16 != 0) {
                auVar66._0_4_ = auVar52._0_4_ & (uint)fVar139;
                auVar66._4_4_ = auVar52._4_4_ & (uint)fVar126;
                auVar66._8_4_ = auVar52._8_4_ & (uint)fVar143;
                auVar66._12_4_ = auVar52._12_4_ & (uint)fVar127;
                auVar81._0_8_ = CONCAT44(~auVar52._4_4_,~auVar52._0_4_) & 0x7f8000007f800000;
                auVar81._8_4_ = ~auVar52._8_4_ & 0x7f800000;
                auVar81._12_4_ = ~auVar52._12_4_ & 0x7f800000;
                auVar81 = auVar81 | auVar66;
                auVar93._4_4_ = auVar81._0_4_;
                auVar93._0_4_ = auVar81._4_4_;
                auVar93._8_4_ = auVar81._12_4_;
                auVar93._12_4_ = auVar81._8_4_;
                auVar96 = minps(auVar93,auVar81);
                auVar67._0_8_ = auVar96._8_8_;
                auVar67._8_4_ = auVar96._0_4_;
                auVar67._12_4_ = auVar96._4_4_;
                auVar96 = minps(auVar67,auVar96);
                auVar68._0_8_ =
                     CONCAT44(-(uint)(auVar96._4_4_ == auVar81._4_4_) & auVar52._4_4_,
                              -(uint)(auVar96._0_4_ == auVar81._0_4_) & auVar52._0_4_);
                auVar68._8_4_ = -(uint)(auVar96._8_4_ == auVar81._8_4_) & auVar52._8_4_;
                auVar68._12_4_ = -(uint)(auVar96._12_4_ == auVar81._12_4_) & auVar52._12_4_;
                iVar16 = movmskps(iVar16,auVar68);
                if (iVar16 != 0) {
                  auVar52._8_4_ = auVar68._8_4_;
                  auVar52._0_8_ = auVar68._0_8_;
                  auVar52._12_4_ = auVar68._12_4_;
                }
                uVar17 = movmskps(iVar16,auVar52);
                uVar19 = CONCAT44(local_1248._4_4_,uVar17);
                lVar23 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                goto LAB_0058e773;
              }
            }
          }
        }
      }
      if (2 < (uint)uVar27) {
        pfVar6 = (float *)(lVar28 + uVar18 * 4);
        local_11b0 = pfVar6 + -1;
        local_1218._4_4_ = *pfVar6;
        pfVar7 = local_11b0 + uVar18;
        fVar156 = pfVar7[1];
        fVar157 = pfVar7[2];
        uStack_1210._4_4_ = pfVar6[1];
        if (uVar18 == 2) {
          fVar157 = fVar156;
          uStack_1210._4_4_ = (float)local_1218._4_4_;
        }
        uVar19 = (ulong)*(uint *)(uVar21 + 0x14);
        pfVar6 = local_11b0 + uVar19;
        fVar139 = pfVar6[1];
        pfVar2 = pfVar6 + uVar18;
        fVar126 = pfVar2[1];
        fVar143 = pfVar6[2];
        fVar127 = pfVar2[2];
        if (uVar18 == 2) {
          fVar143 = fVar139;
          fVar127 = fVar126;
        }
        pfVar3 = local_11b0 + uVar19 * 2;
        fVar105 = pfVar3[1];
        pfVar4 = pfVar3 + uVar18;
        fVar149 = pfVar4[1];
        fVar107 = pfVar3[2];
        fVar129 = pfVar4[2];
        if (uVar18 == 2) {
          fVar107 = fVar105;
          fVar129 = fVar149;
        }
        fVar72 = *(float *)&This->ptr;
        fVar83 = *(float *)((long)&This->ptr + 4);
        fVar84 = *(float *)&This->leafIntersector;
        local_1028 = *(float *)&(This->collider).collide;
        fVar130 = *(float *)((long)&(This->collider).collide + 4);
        fStack_1230 = *(float *)&(This->collider).name;
        fVar116 = *local_11b0 - fVar72;
        fVar119 = *pfVar7 - fVar72;
        fStack_1140 = (float)local_1218._4_4_ - fVar72;
        fStack_113c = fVar156 - fVar72;
        fVar108 = *pfVar6 - fVar83;
        fVar112 = *pfVar2 - fVar83;
        fStack_1150 = fVar139 - fVar83;
        fStack_114c = fVar126 - fVar83;
        local_1158 = CONCAT44(fVar112,fVar108);
        local_11f8._0_4_ = *pfVar3 - fVar84;
        local_11f8._4_4_ = *pfVar4 - fVar84;
        fStack_11f0 = fVar105 - fVar84;
        fStack_11ec = fVar149 - fVar84;
        local_1218._0_4_ = (float)local_1218._4_4_ - fVar72;
        local_1218._4_4_ = (float)local_1218._4_4_ - fVar72;
        uStack_1210._0_4_ = uStack_1210._4_4_ - fVar72;
        uStack_1210._4_4_ = uStack_1210._4_4_ - fVar72;
        fVar136 = fVar139 - fVar83;
        fVar139 = fVar139 - fVar83;
        fVar142 = fVar143 - fVar83;
        fVar143 = fVar143 - fVar83;
        fVar95 = fVar105 - fVar84;
        fVar105 = fVar105 - fVar84;
        fVar106 = fVar107 - fVar84;
        fVar107 = fVar107 - fVar84;
        fVar154 = *pfVar7 - fVar72;
        fVar155 = fVar156 - fVar72;
        fVar156 = fVar156 - fVar72;
        fVar157 = fVar157 - fVar72;
        fVar122 = *pfVar2 - fVar83;
        fVar125 = fVar126 - fVar83;
        fVar126 = fVar126 - fVar83;
        fVar127 = fVar127 - fVar83;
        fVar128 = *pfVar4 - fVar84;
        fVar135 = fVar149 - fVar84;
        fVar149 = fVar149 - fVar84;
        fVar129 = fVar129 - fVar84;
        fVar145 = fVar154 - fVar116;
        fVar141 = fVar155 - fVar119;
        fVar150 = fVar156 - fStack_1140;
        fVar152 = fVar157 - fStack_113c;
        fVar137 = fVar122 - fVar108;
        fVar140 = fVar125 - fVar112;
        fStack_1200 = fVar126 - fStack_1150;
        fStack_11fc = fVar127 - fStack_114c;
        fVar158 = fVar128 - (float)local_11f8._0_4_;
        fVar160 = fVar135 - (float)local_11f8._4_4_;
        fStack_11d0 = fVar149 - fStack_11f0;
        fStack_11cc = fVar129 - fStack_11ec;
        local_11d8 = CONCAT44(fVar160,fVar158);
        local_1208 = (Scene *)CONCAT44(fVar140,fVar137);
        local_1228._4_4_ = fVar141;
        local_1228._0_4_ = fVar145;
        uStack_1220._0_4_ = fVar150;
        uStack_1220._4_4_ = fVar152;
        local_1238 = (RayQueryContext *)CONCAT44(fStack_1230,fStack_1230);
        fStack_122c = fStack_1230;
        fVar72 = fVar108 - fVar136;
        fVar83 = fVar112 - fVar139;
        fVar84 = fStack_1150 - fVar142;
        fVar144 = fStack_114c - fVar143;
        fVar164 = (fVar137 * (fVar128 + (float)local_11f8._0_4_) - fVar158 * (fVar122 + fVar108)) *
                  local_1028 +
                  (fVar158 * (fVar154 + fVar116) - (fVar128 + (float)local_11f8._0_4_) * fVar145) *
                  fVar130 + ((fVar122 + fVar108) * fVar145 - (fVar154 + fVar116) * fVar137) *
                            fStack_1230;
        fVar167 = (fVar140 * (fVar135 + (float)local_11f8._4_4_) - fVar160 * (fVar125 + fVar112)) *
                  local_1028 +
                  (fVar160 * (fVar155 + fVar119) - (fVar135 + (float)local_11f8._4_4_) * fVar141) *
                  fVar130 + ((fVar125 + fVar112) * fVar141 - (fVar155 + fVar119) * fVar140) *
                            fStack_1230;
        local_1228 = (undefined1  [8])CONCAT44(fVar167,fVar164);
        uStack_1220._0_4_ =
             (fStack_1200 * (fVar149 + fStack_11f0) - fStack_11d0 * (fVar126 + fStack_1150)) *
             local_1028 +
             (fStack_11d0 * (fVar156 + fStack_1140) - (fVar149 + fStack_11f0) * fVar150) * fVar130 +
             ((fVar126 + fStack_1150) * fVar150 - (fVar156 + fStack_1140) * fStack_1200) *
             fStack_1230;
        uStack_1220._4_4_ =
             (fStack_11fc * (fVar129 + fStack_11ec) - fStack_11cc * (fVar127 + fStack_114c)) *
             local_1028 +
             (fStack_11cc * (fVar157 + fStack_113c) - (fVar129 + fStack_11ec) * fVar152) * fVar130 +
             ((fVar127 + fStack_114c) * fVar152 - (fVar157 + fStack_113c) * fStack_11fc) *
             fStack_1230;
        fVar146 = (float)local_11f8._0_4_ - fVar95;
        fVar148 = (float)local_11f8._4_4_ - fVar105;
        fVar151 = fStack_11f0 - fVar106;
        fVar153 = fStack_11ec - fVar107;
        fVar109 = fVar116 - (float)local_1218._0_4_;
        fVar113 = fVar119 - (float)local_1218._4_4_;
        fVar114 = fStack_1140 - (float)uStack_1210;
        fVar115 = fStack_113c - uStack_1210._4_4_;
        local_1148 = CONCAT44(fVar119,fVar116);
        auVar133._0_4_ =
             (fVar72 * ((float)local_11f8._0_4_ + fVar95) - fVar146 * (fVar108 + fVar136)) *
             local_1028 +
             (fVar146 * (fVar116 + (float)local_1218._0_4_) -
             ((float)local_11f8._0_4_ + fVar95) * fVar109) * fVar130 +
             ((fVar108 + fVar136) * fVar109 - (fVar116 + (float)local_1218._0_4_) * fVar72) *
             fStack_1230;
        auVar133._4_4_ =
             (fVar83 * ((float)local_11f8._4_4_ + fVar105) - fVar148 * (fVar112 + fVar139)) *
             local_1028 +
             (fVar148 * (fVar119 + (float)local_1218._4_4_) -
             ((float)local_11f8._4_4_ + fVar105) * fVar113) * fVar130 +
             ((fVar112 + fVar139) * fVar113 - (fVar119 + (float)local_1218._4_4_) * fVar83) *
             fStack_1230;
        auVar133._8_4_ =
             (fVar84 * (fStack_11f0 + fVar106) - fVar151 * (fStack_1150 + fVar142)) * local_1028 +
             (fVar151 * (fStack_1140 + (float)uStack_1210) - (fStack_11f0 + fVar106) * fVar114) *
             fVar130 + ((fStack_1150 + fVar142) * fVar114 -
                       (fStack_1140 + (float)uStack_1210) * fVar84) * fStack_1230;
        auVar133._12_4_ =
             (fVar144 * (fStack_11ec + fVar107) - fVar153 * (fStack_114c + fVar143)) * local_1028 +
             (fVar153 * (fStack_113c + uStack_1210._4_4_) - (fStack_11ec + fVar107) * fVar115) *
             fVar130 + ((fStack_114c + fVar143) * fVar115 -
                       (fStack_113c + uStack_1210._4_4_) * fVar144) * fStack_1230;
        local_1248._0_4_ = (float)local_1218._0_4_ - fVar154;
        local_1248._4_4_ = (float)local_1218._4_4_ - fVar155;
        fStack_1240 = (float)uStack_1210 - fVar156;
        fStack_123c = uStack_1210._4_4_ - fVar157;
        fVar159 = fVar136 - fVar122;
        fVar161 = fVar139 - fVar125;
        fVar162 = fVar142 - fVar126;
        fVar163 = fVar143 - fVar127;
        fVar138 = fVar95 - fVar128;
        fVar120 = fVar105 - fVar135;
        fVar121 = fVar106 - fVar149;
        fVar147 = fVar107 - fVar129;
        auVar91._0_4_ =
             (fVar159 * (fVar128 + fVar95) - fVar138 * (fVar122 + fVar136)) * local_1028 +
             (fVar138 * (fVar154 + (float)local_1218._0_4_) -
             (fVar128 + fVar95) * (float)local_1248._0_4_) * fVar130 +
             ((fVar122 + fVar136) * (float)local_1248._0_4_ -
             (fVar154 + (float)local_1218._0_4_) * fVar159) * fStack_1230;
        auVar91._4_4_ =
             (fVar161 * (fVar135 + fVar105) - fVar120 * (fVar125 + fVar139)) * local_1028 +
             (fVar120 * (fVar155 + (float)local_1218._4_4_) -
             (fVar135 + fVar105) * (float)local_1248._4_4_) * fVar130 +
             ((fVar125 + fVar139) * (float)local_1248._4_4_ -
             (fVar155 + (float)local_1218._4_4_) * fVar161) * fStack_1230;
        auVar91._8_4_ =
             (fVar162 * (fVar149 + fVar106) - fVar121 * (fVar126 + fVar142)) * local_1028 +
             (fVar121 * (fVar156 + (float)uStack_1210) - (fVar149 + fVar106) * fStack_1240) *
             fVar130 + ((fVar126 + fVar142) * fStack_1240 - (fVar156 + (float)uStack_1210) * fVar162
                       ) * fStack_1230;
        auVar91._12_4_ =
             (fVar163 * (fVar129 + fVar107) - fVar147 * (fVar127 + fVar143)) * local_1028 +
             (fVar147 * (fVar157 + uStack_1210._4_4_) - (fVar129 + fVar107) * fStack_123c) * fVar130
             + ((fVar127 + fVar143) * fStack_123c - (fVar157 + uStack_1210._4_4_) * fVar163) *
               fStack_1230;
        local_1168 = fVar164 + auVar133._0_4_ + auVar91._0_4_;
        fStack_1164 = fVar167 + auVar133._4_4_ + auVar91._4_4_;
        fStack_1160 = (float)uStack_1220 + auVar133._8_4_ + auVar91._8_4_;
        fStack_115c = uStack_1220._4_4_ + auVar133._12_4_ + auVar91._12_4_;
        auVar124._8_4_ = (float)uStack_1220;
        auVar124._0_8_ = local_1228;
        auVar124._12_4_ = uStack_1220._4_4_;
        auVar96 = minps(auVar124,auVar133);
        auVar73 = minps(auVar96,auVar91);
        auVar103._8_4_ = (float)uStack_1220;
        auVar103._0_8_ = local_1228;
        auVar103._12_4_ = uStack_1220._4_4_;
        auVar96 = maxps(auVar103,auVar133);
        auVar96 = maxps(auVar96,auVar91);
        local_1038 = ABS(local_1168);
        fStack_1034 = ABS(fStack_1164);
        fStack_1030 = ABS(fStack_1160);
        fStack_102c = ABS(fStack_115c);
        context = (RayQueryContext *)(uVar19 * 0xc);
        local_11b0 = local_11b0 + uVar19 * 3;
        local_11a8 = uVar18;
        local_11a0 = uVar27;
        auVar104._0_4_ =
             -(uint)(auVar96._0_4_ <= local_1038 * 1.1920929e-07 ||
                    -(local_1038 * 1.1920929e-07) <= auVar73._0_4_) & local_fe8;
        auVar104._4_4_ =
             -(uint)(auVar96._4_4_ <= fStack_1034 * 1.1920929e-07 ||
                    -(fStack_1034 * 1.1920929e-07) <= auVar73._4_4_) & uStack_fe4;
        auVar104._8_4_ =
             -(uint)(auVar96._8_4_ <= fStack_1030 * 1.1920929e-07 ||
                    -(fStack_1030 * 1.1920929e-07) <= auVar73._8_4_) & uStack_fe0;
        auVar104._12_4_ =
             -(uint)(auVar96._12_4_ <= fStack_102c * 1.1920929e-07 ||
                    -(fStack_102c * 1.1920929e-07) <= auVar73._12_4_) & uStack_fdc;
        iVar16 = movmskps((int)local_11b0,auVar104);
        if (iVar16 != 0) {
          _local_1218 = auVar133;
          fStack_1024 = local_1028;
          fStack_1020 = local_1028;
          fStack_101c = local_1028;
          uVar34 = -(uint)(ABS(fVar146 * fVar159) <= ABS(fVar158 * fVar72));
          uVar36 = -(uint)(ABS(fVar148 * fVar161) <= ABS(fVar160 * fVar83));
          uVar40 = -(uint)(ABS(fVar151 * fVar162) <= ABS(fStack_11d0 * fVar84));
          uVar43 = -(uint)(ABS(fVar153 * fVar163) <= ABS(fStack_11cc * fVar144));
          uVar35 = -(uint)(ABS(fVar109 * fVar138) <= ABS(fVar145 * fVar146));
          uVar37 = -(uint)(ABS(fVar113 * fVar120) <= ABS(fVar141 * fVar148));
          uVar41 = -(uint)(ABS(fVar114 * fVar121) <= ABS(fVar150 * fVar151));
          uVar44 = -(uint)(ABS(fVar115 * fVar147) <= ABS(fVar152 * fVar153));
          uVar39 = -(uint)(ABS(fVar72 * (float)local_1248._0_4_) <= ABS(fVar137 * fVar109));
          uVar38 = -(uint)(ABS(fVar83 * (float)local_1248._4_4_) <= ABS(fVar140 * fVar113));
          uVar42 = -(uint)(ABS(fVar84 * fStack_1240) <= ABS(fStack_1200 * fVar114));
          uVar45 = -(uint)(ABS(fVar144 * fStack_123c) <= ABS(fStack_11fc * fVar115));
          local_1088[0] =
               (float)(~uVar34 & (uint)(fVar137 * fVar146 - fVar158 * fVar72) |
                      (uint)(fVar72 * fVar138 - fVar146 * fVar159) & uVar34);
          local_1088[1] =
               (float)(~uVar36 & (uint)(fVar140 * fVar148 - fVar160 * fVar83) |
                      (uint)(fVar83 * fVar120 - fVar148 * fVar161) & uVar36);
          local_1088[2] =
               (float)(~uVar40 & (uint)(fStack_1200 * fVar151 - fStack_11d0 * fVar84) |
                      (uint)(fVar84 * fVar121 - fVar151 * fVar162) & uVar40);
          local_1088[3] =
               (float)(~uVar43 & (uint)(fStack_11fc * fVar153 - fStack_11cc * fVar144) |
                      (uint)(fVar144 * fVar147 - fVar153 * fVar163) & uVar43);
          local_1078[0] =
               (float)(~uVar35 & (uint)(fVar158 * fVar109 - fVar145 * fVar146) |
                      (uint)(fVar146 * (float)local_1248._0_4_ - fVar109 * fVar138) & uVar35);
          local_1078[1] =
               (float)(~uVar37 & (uint)(fVar160 * fVar113 - fVar141 * fVar148) |
                      (uint)(fVar148 * (float)local_1248._4_4_ - fVar113 * fVar120) & uVar37);
          local_1078[2] =
               (float)(~uVar41 & (uint)(fStack_11d0 * fVar114 - fVar150 * fVar151) |
                      (uint)(fVar151 * fStack_1240 - fVar114 * fVar121) & uVar41);
          local_1078[3] =
               (float)(~uVar44 & (uint)(fStack_11cc * fVar115 - fVar152 * fVar153) |
                      (uint)(fVar153 * fStack_123c - fVar115 * fVar147) & uVar44);
          local_10e8._4_4_ = fStack_1164;
          local_10e8._0_4_ = local_1168;
          local_10e8._8_4_ = fStack_1160;
          local_10e8._12_4_ = fStack_115c;
          local_1068[0] =
               (float)(~uVar39 & (uint)(fVar145 * fVar72 - fVar137 * fVar109) |
                      (uint)(fVar109 * fVar159 - fVar72 * (float)local_1248._0_4_) & uVar39);
          local_1068[1] =
               (float)(~uVar38 & (uint)(fVar141 * fVar83 - fVar140 * fVar113) |
                      (uint)(fVar113 * fVar161 - fVar83 * (float)local_1248._4_4_) & uVar38);
          local_1068[2] =
               (float)(~uVar42 & (uint)(fVar150 * fVar84 - fStack_1200 * fVar114) |
                      (uint)(fVar114 * fVar162 - fVar84 * fStack_1240) & uVar42);
          local_1068[3] =
               (float)(~uVar45 & (uint)(fVar152 * fVar144 - fStack_11fc * fVar115) |
                      (uint)(fVar115 * fVar163 - fVar144 * fStack_123c) & uVar45);
          fVar156 = local_1028 * local_1088[0] +
                    fVar130 * local_1078[0] + fStack_1230 * local_1068[0];
          fVar157 = local_1028 * local_1088[1] +
                    fVar130 * local_1078[1] + fStack_1230 * local_1068[1];
          fVar139 = local_1028 * local_1088[2] +
                    fVar130 * local_1078[2] + fStack_1230 * local_1068[2];
          fVar126 = local_1028 * local_1088[3] +
                    fVar130 * local_1078[3] + fStack_1230 * local_1068[3];
          auVar49._0_4_ = fVar156 + fVar156;
          auVar49._4_4_ = fVar157 + fVar157;
          auVar49._8_4_ = fVar139 + fVar139;
          auVar49._12_4_ = fVar126 + fVar126;
          auVar62._0_4_ = (float)local_11f8._0_4_ * local_1068[0];
          auVar62._4_4_ = (float)local_11f8._4_4_ * local_1068[1];
          auVar62._8_4_ = fStack_11f0 * local_1068[2];
          auVar62._12_4_ = fStack_11ec * local_1068[3];
          fVar139 = fVar116 * local_1088[0] + fVar108 * local_1078[0] + auVar62._0_4_;
          fVar126 = fVar119 * local_1088[1] + fVar112 * local_1078[1] + auVar62._4_4_;
          fVar105 = fStack_1140 * local_1088[2] + fStack_1150 * local_1078[2] + auVar62._8_4_;
          fVar149 = fStack_113c * local_1088[3] + fStack_114c * local_1078[3] + auVar62._12_4_;
          auVar96 = rcpps(auVar62,auVar49);
          fVar156 = auVar96._0_4_;
          fVar157 = auVar96._4_4_;
          fVar143 = auVar96._8_4_;
          fVar127 = auVar96._12_4_;
          fVar139 = ((1.0 - auVar49._0_4_ * fVar156) * fVar156 + fVar156) * (fVar139 + fVar139);
          fVar126 = ((1.0 - auVar49._4_4_ * fVar157) * fVar157 + fVar157) * (fVar126 + fVar126);
          fVar143 = ((1.0 - auVar49._8_4_ * fVar143) * fVar143 + fVar143) * (fVar105 + fVar105);
          fVar127 = ((1.0 - auVar49._12_4_ * fVar127) * fVar127 + fVar127) * (fVar149 + fVar149);
          pIVar1 = &This->intersector1;
          fVar156 = *(float *)&pIVar1->intersect;
          fVar157 = *(float *)((long)&This->leafIntersector + 4);
          bVar13 = fVar139 <= fVar156 && fVar157 <= fVar139;
          auVar79._0_4_ = -(uint)bVar13;
          bVar14 = fVar126 <= fVar156 && fVar157 <= fVar126;
          auVar79._4_4_ = -(uint)bVar14;
          bVar12 = fVar143 <= fVar156 && fVar157 <= fVar143;
          auVar79._8_4_ = -(uint)bVar12;
          bVar11 = fVar127 <= fVar156 && fVar157 <= fVar127;
          auVar79._12_4_ = -(uint)bVar11;
          auVar50._0_4_ = (int)((uint)(auVar49._0_4_ != 0.0 && bVar13) * -0x80000000) >> 0x1f;
          auVar50._4_4_ = (int)((uint)(auVar49._4_4_ != 0.0 && bVar14) * -0x80000000) >> 0x1f;
          auVar50._8_4_ = (int)((uint)(auVar49._8_4_ != 0.0 && bVar12) * -0x80000000) >> 0x1f;
          auVar50._12_4_ = (int)((uint)(auVar49._12_4_ != 0.0 && bVar11) * -0x80000000) >> 0x1f;
          auVar51 = auVar50 & auVar104;
          iVar16 = movmskps(iVar16,auVar51);
          if (iVar16 != 0) {
            uVar34 = *(uint *)(uVar21 + 0x18);
            auVar25 = (undefined1  [8])CONCAT44(0,uVar34);
            uVar26 = *(undefined4 *)(uVar21 + 0x1c);
            local_1108 = _local_1228;
            local_10f8 = auVar133._0_4_;
            fStack_10f4 = auVar133._4_4_;
            fStack_10f0 = auVar133._8_4_;
            fStack_10ec = auVar133._12_4_;
            local_10d8 = &local_11b0;
            local_10c8 = auVar51;
            local_1098[0] = fVar139;
            local_1098[1] = fVar126;
            local_1098[2] = fVar143;
            local_1098[3] = fVar127;
            context = *(RayQueryContext **)(*(long *)&(ray->super_RayK<1>).org.field_0 + 0x1e8);
            pSVar29 = (&context->scene)[(long)auVar25];
            if ((*(uint *)((long)&(pSVar29->super_AccelN).super_Accel.super_AccelData.bounds.bounds1
                                  .lower + 4) & *(uint *)((long)&(This->intersector1).intersect + 4)
                ) != 0) {
              local_11c8 = auVar51;
              fVar156 = local_11b0[1];
              pfVar6 = local_11b0 + uVar18;
              fVar157 = *pfVar6;
              fVar105 = pfVar6[1];
              fVar149 = local_11b0[2];
              fVar107 = pfVar6[2];
              if (uVar18 == 2) {
                fVar149 = fVar156;
                fVar107 = fVar105;
              }
              auVar96 = rcpps(auVar79,local_10e8);
              fVar129 = auVar96._0_4_;
              fVar72 = auVar96._4_4_;
              fVar83 = auVar96._8_4_;
              fVar84 = auVar96._12_4_;
              fVar129 = (float)(-(uint)(1e-18 <= local_1038) &
                               (uint)(((float)DAT_01f46a60 - local_1168 * fVar129) * fVar129 +
                                     fVar129));
              fVar72 = (float)(-(uint)(1e-18 <= fStack_1034) &
                              (uint)((DAT_01f46a60._4_4_ - fStack_1164 * fVar72) * fVar72 + fVar72))
              ;
              fVar83 = (float)(-(uint)(1e-18 <= fStack_1030) &
                              (uint)((DAT_01f46a60._8_4_ - fStack_1160 * fVar83) * fVar83 + fVar83))
              ;
              fVar84 = (float)(-(uint)(1e-18 <= fStack_102c) &
                              (uint)((DAT_01f46a60._12_4_ - fStack_115c * fVar84) * fVar84 + fVar84)
                              );
              auVar166._0_4_ = fVar164 * fVar129;
              auVar166._4_4_ = fVar167 * fVar72;
              auVar166._8_4_ = (float)uStack_1220 * fVar83;
              auVar166._12_4_ = uStack_1220._4_4_ * fVar84;
              auVar73 = minps(auVar166,_DAT_01f46a60);
              auVar134._0_4_ = auVar133._0_4_ * fVar129;
              auVar134._4_4_ = auVar133._4_4_ * fVar72;
              auVar134._8_4_ = auVar133._8_4_ * fVar83;
              auVar134._12_4_ = auVar133._12_4_ * fVar84;
              auVar96 = minps(auVar134,_DAT_01f46a60);
              fVar108 = auVar73._0_4_;
              fVar109 = auVar73._4_4_;
              fVar112 = auVar73._8_4_;
              fVar113 = auVar73._12_4_;
              fVar130 = auVar96._0_4_;
              fVar144 = auVar96._4_4_;
              fVar95 = auVar96._8_4_;
              fVar106 = auVar96._12_4_;
              fVar129 = ((float)DAT_01f46a60 - fVar108) - fVar130;
              fVar72 = (DAT_01f46a60._4_4_ - fVar109) - fVar144;
              fVar83 = (DAT_01f46a60._8_4_ - fVar112) - fVar95;
              fVar84 = (DAT_01f46a60._12_4_ - fVar113) - fVar106;
              local_10b8[0] =
                   (float)((uint)*local_11b0 & 0xffff) * 0.00012207031 * fVar129 +
                   (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar130 +
                   (float)((uint)fVar156 & 0xffff) * 0.00012207031 * fVar108;
              local_10b8[1] =
                   (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar72 +
                   (float)((uint)fVar105 & 0xffff) * 0.00012207031 * fVar144 +
                   (float)((uint)fVar156 & 0xffff) * 0.00012207031 * fVar109;
              local_10b8[2] =
                   (float)((uint)fVar156 & 0xffff) * 0.00012207031 * fVar83 +
                   (float)((uint)fVar105 & 0xffff) * 0.00012207031 * fVar95 +
                   (float)((uint)fVar149 & 0xffff) * 0.00012207031 * fVar112;
              local_10b8[3] =
                   (float)((uint)fVar105 & 0xffff) * 0.00012207031 * fVar84 +
                   (float)((uint)fVar107 & 0xffff) * 0.00012207031 * fVar106 +
                   (float)((uint)fVar149 & 0xffff) * 0.00012207031 * fVar113;
              local_10a8[0] =
                   fVar129 * (float)((uint)*local_11b0 >> 0x10) * 0.00012207031 +
                   (float)((uint)fVar157 >> 0x10) * 0.00012207031 * fVar130 +
                   (float)((uint)fVar156 >> 0x10) * 0.00012207031 * fVar108;
              local_10a8[1] =
                   fVar72 * (float)((uint)fVar157 >> 0x10) * 0.00012207031 +
                   (float)((uint)fVar105 >> 0x10) * 0.00012207031 * fVar144 +
                   (float)((uint)fVar156 >> 0x10) * 0.00012207031 * fVar109;
              local_10a8[2] =
                   fVar83 * (float)((uint)fVar156 >> 0x10) * 0.00012207031 +
                   (float)((uint)fVar105 >> 0x10) * 0.00012207031 * fVar95 +
                   (float)((uint)fVar149 >> 0x10) * 0.00012207031 * fVar112;
              local_10a8[3] =
                   fVar84 * (float)((uint)fVar105 >> 0x10) * 0.00012207031 +
                   (float)((uint)fVar107 >> 0x10) * 0.00012207031 * fVar106 +
                   (float)((uint)fVar149 >> 0x10) * 0.00012207031 * fVar113;
              uVar35 = auVar51._0_4_;
              uVar39 = auVar51._4_4_;
              uVar36 = auVar51._8_4_;
              uVar37 = auVar51._12_4_;
              auVar63._0_4_ = uVar35 & (uint)fVar139;
              auVar63._4_4_ = uVar39 & (uint)fVar126;
              auVar63._8_4_ = uVar36 & (uint)fVar143;
              auVar63._12_4_ = uVar37 & (uint)fVar127;
              auVar80._0_8_ = CONCAT44(~uVar39,~uVar35) & 0x7f8000007f800000;
              auVar80._8_4_ = ~uVar36 & 0x7f800000;
              auVar80._12_4_ = ~uVar37 & 0x7f800000;
              auVar80 = auVar80 | auVar63;
              auVar92._4_4_ = auVar80._0_4_;
              auVar92._0_4_ = auVar80._4_4_;
              auVar92._8_4_ = auVar80._12_4_;
              auVar92._12_4_ = auVar80._8_4_;
              auVar96 = minps(auVar92,auVar80);
              auVar64._0_8_ = auVar96._8_8_;
              auVar64._8_4_ = auVar96._0_4_;
              auVar64._12_4_ = auVar96._4_4_;
              auVar96 = minps(auVar64,auVar96);
              auVar65._0_8_ =
                   CONCAT44(-(uint)(auVar96._4_4_ == auVar80._4_4_) & uVar39,
                            -(uint)(auVar96._0_4_ == auVar80._0_4_) & uVar35);
              auVar65._8_4_ = -(uint)(auVar96._8_4_ == auVar80._8_4_) & uVar36;
              auVar65._12_4_ = -(uint)(auVar96._12_4_ == auVar80._12_4_) & uVar37;
              iVar16 = movmskps((int)local_11b0,auVar65);
              if (iVar16 != 0) {
                auVar51._8_4_ = auVar65._8_4_;
                auVar51._0_8_ = auVar65._0_8_;
                auVar51._12_4_ = auVar65._12_4_;
              }
              uVar17 = movmskps(iVar16,auVar51);
              uVar18 = CONCAT44((int)((ulong)local_11b0 >> 0x20),uVar17);
              local_1238 = (RayQueryContext *)0x0;
              if (uVar18 != 0) {
                for (; (uVar18 >> (long)local_1238 & 1) == 0;
                    local_1238 = (RayQueryContext *)((long)local_1238 + 1)) {
                }
              }
              pRVar22 = *(RayQueryContext **)&(ray->super_RayK<1>).dir.field_0;
              if ((pRVar22->args == (RTCIntersectArguments *)0x0) &&
                 (*(long *)&(pSVar29->super_AccelN).super_Accel.super_AccelData.bounds.bounds1.upper
                            .field_0 == 0)) {
                fVar156 = local_10b8[(long)local_1238];
                fVar157 = local_10a8[(long)local_1238];
                fVar139 = local_1088[(long)local_1238];
                fVar126 = local_1078[(long)local_1238];
                fVar143 = local_1068[(long)local_1238];
                *(float *)&(This->intersector1).intersect = local_1098[(long)local_1238];
                *(float *)&(This->intersector1).pointQuery = fVar139;
                *(float *)((long)&(This->intersector1).pointQuery + 4) = fVar126;
                *(float *)&(This->intersector1).name = fVar143;
                *(float *)((long)&(This->intersector1).name + 4) = fVar156;
                *(float *)&(This->intersector4).intersect = fVar157;
                *(undefined4 *)((long)&(This->intersector4).intersect + 4) = uVar26;
                *(uint *)&(This->intersector4).occluded = uVar34;
                puVar20 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                uVar34 = *puVar20;
                context = (RayQueryContext *)(ulong)uVar34;
                *(uint *)((long)&(This->intersector4).occluded + 4) = uVar34;
                *(uint *)&(This->intersector4).name = puVar20[1];
              }
              else {
                local_1248 = (undefined1  [8])pIVar1->intersect;
                _fStack_1240 = pIVar1->occluded;
                uStack_1210 = auVar133._8_8_;
                local_1218 = (undefined1  [8])
                             *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                local_11f8._4_4_ = fVar126;
                local_11f8._0_4_ = fVar139;
                fStack_11f0 = fVar143;
                fStack_11ec = fVar127;
                local_1228 = auVar25;
                local_11d8 = CONCAT44(fVar160,uVar26);
                local_1208 = pSVar29;
LAB_0058ea3f:
                local_112c = local_10b8[(long)local_1238];
                local_1128 = local_10a8[(long)local_1238];
                *(float *)&(This->intersector1).intersect = local_1098[(long)local_1238];
                local_1138 = local_1088[(long)local_1238];
                local_1134 = local_1078[(long)local_1238];
                local_1130 = local_1068[(long)local_1238];
                local_1124 = uVar26;
                local_1120 = SUB84(auVar25,0);
                local_111c = *(float *)(Scene **)local_1218;
                local_1118 = *(float *)((long)(Scene **)local_1218 + 4);
                local_124c = -1;
                local_1198 = &local_124c;
                local_1190 = (Scene *)*(undefined8 *)
                                       ((long)&(pSVar29->super_AccelN).super_Accel.super_AccelData.
                                               bounds.bounds0.lower + 8);
                local_1188 = (RayQueryContext *)local_1218;
                local_1180 = This;
                local_1178 = &local_1138;
                local_1170 = 1;
                pcVar10 = *(code **)&(pSVar29->super_AccelN).super_Accel.super_AccelData.bounds.
                                     bounds1.upper.field_0;
                if (pcVar10 == (code *)0x0) {
LAB_0058eb6f:
                  if ((pRVar22->args != (RTCIntersectArguments *)0x0) &&
                     ((((ulong)pRVar22->scene & 2) != 0 ||
                      ((*(byte *)((long)&(pSVar29->super_AccelN).super_Accel.super_AccelData.bounds.
                                         bounds1.lower + 0xe) & 0x40) != 0)))) {
                    context = pRVar22;
                    (*(code *)pRVar22->args)(&local_1198);
                    This = local_11e0;
                    auVar25 = local_1228;
                    pSVar29 = local_1208;
                    uVar30 = local_11e8;
                    fVar139 = (float)local_11f8._0_4_;
                    fVar126 = (float)local_11f8._4_4_;
                    fVar143 = fStack_11f0;
                    fVar127 = fStack_11ec;
                    uVar26 = (undefined4)local_11d8;
                    if (*local_1198 == 0) goto LAB_0058ec2f;
                  }
                  *(float *)&(local_1180->intersector1).pointQuery = *local_1178;
                  *(float *)((long)&(local_1180->intersector1).pointQuery + 4) = local_1178[1];
                  *(float *)&(local_1180->intersector1).name = local_1178[2];
                  *(float *)((long)&(local_1180->intersector1).name + 4) = local_1178[3];
                  *(float *)&(local_1180->intersector4).intersect = local_1178[4];
                  *(float *)((long)&(local_1180->intersector4).intersect + 4) = local_1178[5];
                  *(float *)&(local_1180->intersector4).occluded = local_1178[6];
                  *(float *)((long)&(local_1180->intersector4).occluded + 4) = local_1178[7];
                  context = (RayQueryContext *)(ulong)(uint)local_1178[8];
                  *(float *)&(local_1180->intersector4).name = local_1178[8];
                }
                else {
                  context = (RayQueryContext *)local_1218;
                  (*pcVar10)(&local_1198);
                  This = local_11e0;
                  auVar25 = local_1228;
                  pSVar29 = local_1208;
                  uVar30 = local_11e8;
                  fVar139 = (float)local_11f8._0_4_;
                  fVar126 = (float)local_11f8._4_4_;
                  fVar143 = fStack_11f0;
                  fVar127 = fStack_11ec;
                  uVar26 = (undefined4)local_11d8;
                  if (*local_1198 != 0) goto LAB_0058eb6f;
LAB_0058ec2f:
                  *(undefined4 *)&(local_11e0->intersector1).intersect = local_1248._0_4_;
                  This = local_11e0;
                  auVar25 = local_1228;
                  pSVar29 = local_1208;
                  uVar30 = local_11e8;
                  fVar139 = (float)local_11f8._0_4_;
                  fVar126 = (float)local_11f8._4_4_;
                  fVar143 = fStack_11f0;
                  fVar127 = fStack_11ec;
                  uVar26 = (undefined4)local_11d8;
                }
                *(undefined4 *)(local_11c8 + (long)local_1238 * 4) = 0;
                local_1248 = (undefined1  [8])(This->intersector1).intersect;
                _fStack_1240 = (This->intersector1).occluded;
                fVar156 = SUB84(local_1248,0);
                auVar53._0_4_ = -(uint)(fVar139 <= fVar156) & local_11c8._0_4_;
                auVar53._4_4_ = -(uint)(fVar126 <= fVar156) & local_11c8._4_4_;
                auVar53._8_4_ = -(uint)(fVar143 <= fVar156) & local_11c8._8_4_;
                auVar53._12_4_ = -(uint)(fVar127 <= fVar156) & local_11c8._12_4_;
                local_11c8 = auVar53;
                iVar16 = movmskps((int)local_1238,auVar53);
                if (iVar16 != 0) {
                  auVar69._0_4_ = auVar53._0_4_ & (uint)fVar139;
                  auVar69._4_4_ = auVar53._4_4_ & (uint)fVar126;
                  auVar69._8_4_ = auVar53._8_4_ & (uint)fVar143;
                  auVar69._12_4_ = auVar53._12_4_ & (uint)fVar127;
                  auVar82._0_8_ = CONCAT44(~auVar53._4_4_,~auVar53._0_4_) & 0x7f8000007f800000;
                  auVar82._8_4_ = ~auVar53._8_4_ & 0x7f800000;
                  auVar82._12_4_ = ~auVar53._12_4_ & 0x7f800000;
                  auVar82 = auVar82 | auVar69;
                  auVar94._4_4_ = auVar82._0_4_;
                  auVar94._0_4_ = auVar82._4_4_;
                  auVar94._8_4_ = auVar82._12_4_;
                  auVar94._12_4_ = auVar82._8_4_;
                  auVar96 = minps(auVar94,auVar82);
                  auVar70._0_8_ = auVar96._8_8_;
                  auVar70._8_4_ = auVar96._0_4_;
                  auVar70._12_4_ = auVar96._4_4_;
                  auVar96 = minps(auVar70,auVar96);
                  auVar71._0_8_ =
                       CONCAT44(-(uint)(auVar96._4_4_ == auVar82._4_4_) & auVar53._4_4_,
                                -(uint)(auVar96._0_4_ == auVar82._0_4_) & auVar53._0_4_);
                  auVar71._8_4_ = -(uint)(auVar96._8_4_ == auVar82._8_4_) & auVar53._8_4_;
                  auVar71._12_4_ = -(uint)(auVar96._12_4_ == auVar82._12_4_) & auVar53._12_4_;
                  iVar16 = movmskps(iVar16,auVar71);
                  if (iVar16 != 0) {
                    auVar53._8_4_ = auVar71._8_4_;
                    auVar53._0_8_ = auVar71._0_8_;
                    auVar53._12_4_ = auVar71._12_4_;
                  }
                  uVar17 = movmskps(iVar16,auVar53);
                  uVar18 = CONCAT44((int)((ulong)local_1238 >> 0x20),uVar17);
                  local_1238 = (RayQueryContext *)0x0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> (long)local_1238 & 1) == 0;
                        local_1238 = (RayQueryContext *)((long)local_1238 + 1)) {
                    }
                  }
                  goto LAB_0058ea3f;
                }
              }
            }
          }
        }
      }
      uVar26 = *(undefined4 *)&(This->intersector1).intersect;
      auVar96._4_4_ = uVar26;
      auVar96._0_4_ = uVar26;
      auVar96._8_4_ = uVar26;
      auVar96._12_4_ = uVar26;
      fVar156 = local_f98;
      fVar157 = fStack_f94;
      fVar127 = fStack_f90;
      fVar105 = fStack_f8c;
      fVar149 = local_fb8;
      fVar107 = fStack_fb4;
      fVar129 = fStack_fb0;
      fVar72 = fStack_fac;
      fVar139 = local_fc8;
      fVar83 = fStack_fc4;
      fVar84 = fStack_fc0;
      fVar130 = fStack_fbc;
      fVar144 = local_fd8;
      fVar95 = fStack_fd4;
      fVar106 = fStack_fd0;
      fVar108 = fStack_fcc;
      fVar126 = local_1048;
      fVar109 = fStack_1044;
      fVar112 = fStack_1040;
      fVar113 = fStack_103c;
      fVar138 = local_1058;
      fVar114 = fStack_1054;
      fVar115 = fStack_1050;
      fVar116 = fStack_104c;
      fVar147 = local_ff8;
      fVar119 = fStack_ff4;
      fVar120 = fStack_ff0;
      fVar121 = fStack_fec;
      fVar135 = local_1008;
      fVar122 = fStack_1004;
      fVar125 = fStack_1000;
      fVar128 = fStack_ffc;
      fVar143 = local_f88;
      fVar136 = fStack_f84;
      fVar137 = fStack_f80;
      fVar140 = fStack_f7c;
      fVar141 = local_fa8;
      fVar142 = fStack_fa4;
      fVar145 = fStack_fa0;
      fVar146 = fStack_f9c;
      goto LAB_0058d51e;
    }
    uVar21 = (ulong)pRVar22 & 0xfffffffffffffff0;
    context = *(RayQueryContext **)(uVar21 + 0x30 + (ulong)*(uint *)(uVar21 + 0x2c));
    uVar26 = *(undefined4 *)&(This->intersector1).intersect;
    auVar96._4_4_ = uVar26;
    auVar96._0_4_ = uVar26;
    auVar96._8_4_ = uVar26;
    auVar96._12_4_ = uVar26;
    if (context != (RayQueryContext *)0x0) {
      *(RayQueryContext **)*pauVar31 = context;
      *(undefined4 *)((long)*pauVar31 + 8) = 0;
      pauVar31 = pauVar31 + 1;
    }
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }